

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O3

void __thiscall hashset<teaminfo>::clear(hashset<teaminfo> *this)

{
  int iVar1;
  chainchunk *pcVar2;
  chainchunk *pcVar3;
  long lVar4;
  
  if (this->numelems != 0) {
    iVar1 = this->size;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        this->chains[lVar4] = (chain *)0x0;
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    this->numelems = 0;
    this->unused = (chain *)0x0;
    pcVar3 = this->chunks;
    while (pcVar3 != (chainchunk *)0x0) {
      pcVar2 = pcVar3->next;
      operator_delete(pcVar3);
      this->chunks = pcVar2;
      pcVar3 = pcVar2;
    }
  }
  return;
}

Assistant:

void clear()
    {
        if(!numelems) return;
        loopi(size) chains[i] = NULL;
        numelems = 0;
        unused = NULL;
        deletechunks();
    }